

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall QWhatsThat::mouseMoveEvent(QWhatsThat *this,QMouseEvent *e)

{
  QPoint QVar1;
  CursorShape CVar2;
  long in_FS_OFFSET;
  QPointF local_68;
  QCursor local_58;
  double dStack_50;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->doc != (QTextDocument *)0x0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::documentLayout();
    local_68 = QSinglePointEvent::position((QSinglePointEvent *)e);
    QVar1 = QPointF::toPoint(&local_68);
    local_58.d = (QCursorData *)(double)(QVar1.xp.m_i.m_i + -0xc);
    dStack_50 = (double)(QVar1.yp.m_i.m_i + -8);
    QAbstractTextDocumentLayout::anchorAt((QPointF *)&local_48);
    if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
      CVar2 = ArrowCursor;
    }
    else {
      CVar2 = PointingHandCursor;
    }
    QCursor::QCursor(&local_58,CVar2);
    QWidget::setCursor(&this->super_QWidget,&local_58);
    QCursor::~QCursor(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::mouseMoveEvent(QMouseEvent* e)
{
#ifdef QT_NO_CURSOR
    Q_UNUSED(e);
#else
    if (!doc)
        return;
    QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
    if (!a.isEmpty())
        setCursor(Qt::PointingHandCursor);
    else
        setCursor(Qt::ArrowCursor);
#endif
}